

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

bool (anonymous_namespace)::lexical_cast<bool,std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  byte bVar1;
  ostream *poVar2;
  long *plVar3;
  bool *pbVar4;
  string *in_RDI;
  scoped_ptr<bool> r;
  bool result;
  stringstream interpreter;
  undefined7 in_stack_fffffffffffffe00;
  byte in_stack_fffffffffffffe07;
  scoped_ptr<bool> local_1c0 [2];
  bool local_199;
  stringstream local_198 [16];
  ostream local_188 [391];
  byte local_1;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,in_RDI);
  bVar1 = std::ios::operator!((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)));
  if ((bVar1 & 1) == 0) {
    plVar3 = (long *)std::istream::operator>>(local_198,&local_199);
    bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::istream::operator>>(local_198,std::ws<char,std::char_traits<char>>);
      in_stack_fffffffffffffe07 = std::ios::eof();
      if ((in_stack_fffffffffffffe07 & 1) != 0) {
        local_1 = local_199 & 1;
        goto LAB_0014af7c;
      }
    }
  }
  pbVar4 = (bool *)operator_new(1);
  *pbVar4 = false;
  MeCab::scoped_ptr<bool>::scoped_ptr(local_1c0,pbVar4);
  pbVar4 = MeCab::scoped_ptr<bool>::operator*(local_1c0);
  local_1 = *pbVar4 & 1;
  MeCab::scoped_ptr<bool>::~scoped_ptr
            ((scoped_ptr<bool> *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
LAB_0014af7c:
  std::__cxx11::stringstream::~stringstream(local_198);
  return (bool)(local_1 & 1);
}

Assistant:

Target lexical_cast(Source arg) {
  std::stringstream interpreter;
  Target result;
  if (!(interpreter << arg) || !(interpreter >> result) ||
      !(interpreter >> std::ws).eof()) {
    MeCab::scoped_ptr<Target> r(new Target());  // return default value
    return *r;
  }
  return result;
}